

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O0

bool __thiscall Func::DoRecordNativeMap(Func *this)

{
  bool bVar1;
  uint sourceContextId;
  uint functionId;
  byte local_21;
  Func *this_local;
  
  if (VTuneChakraProfile::isJitProfilingActive) {
    this_local._7_1_ = true;
  }
  else {
    sourceContextId = GetSourceContextId(this);
    functionId = GetLocalFunctionId(this);
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01ea1258,EncoderPhase,sourceContextId,functionId);
    local_21 = 0;
    if (bVar1) {
      local_21 = DAT_01ec73ca;
    }
    this_local._7_1_ = (bool)(local_21 & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool Func::DoRecordNativeMap() const
{
#if defined(VTUNE_PROFILING)
    if (VTuneChakraProfile::isJitProfilingActive)
    {
        return true;
    }
#endif
#if DBG_DUMP
    return PHASE_DUMP(Js::EncoderPhase, this) && Js::Configuration::Global.flags.Verbose;
#else
    return false;
#endif
}